

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerfHint.cpp
# Opt level: O1

void WritePerfHint(PerfHints hint,FunctionBody *functionBody,uint byteCodeOffset)

{
  PerfHintLevels PVar1;
  LPCWSTR pWVar2;
  LPCWSTR pWVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  LPCWSTR pchUrl;
  char16 *pcVar9;
  char16_t *pcVar10;
  WCHAR local_258 [4];
  TCHAR shortName [255];
  ULONG local_38;
  ULONG local_34;
  ULONG lineNumber;
  LONG columnNumber;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x10,"(functionBody)","functionBody");
    if (!bVar6) goto LAB_0078db8a;
    *puVar8 = 0;
  }
  if (PolymorphicInilineCap < hint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x11,"(((uint)hint) < (sizeof(*__countof_helper(s_perfHintContainer)) + 0))"
                       ,"((uint)hint) < _countof(s_perfHintContainer)");
    if (!bVar6) goto LAB_0078db8a;
    *puVar8 = 0;
  }
  iVar5 = DAT_015d6358;
  pWVar2 = s_perfHintContainer[hint].description;
  unique0x00012000 = s_perfHintContainer[hint].consequences;
  pWVar3 = s_perfHintContainer[hint].suggestion;
  PVar1 = s_perfHintContainer[hint].level;
  bVar6 = s_perfHintContainer[hint].isNotOptimized;
  if (2 < DAT_015d6358) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x16,"(level <= (int)PerfHintLevels::VERBOSE)",
                       "level <= (int)PerfHintLevels::VERBOSE");
    if (!bVar7) {
LAB_0078db8a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if ((int)PVar1 <= iVar5) {
    local_38 = Js::ParseableFunctionInfo::GetLineNumber(&functionBody->super_ParseableFunctionInfo);
    local_34 = Js::ParseableFunctionInfo::GetColumnNumber
                         (&functionBody->super_ParseableFunctionInfo);
    if (byteCodeOffset != 0xffffffff) {
      Js::FunctionBody::GetLineCharOffset
                (functionBody,byteCodeOffset,&local_38,(LONG *)&local_34,false);
      local_38 = local_38 + 1;
      local_34 = local_34 + 1;
    }
    pchUrl = Js::ParseableFunctionInfo::GetSourceName(&functionBody->super_ParseableFunctionInfo);
    Js::FunctionBody::GetShortNameFromUrl(pchUrl,local_258,0xff);
    pcVar10 = L"Optimized";
    if ((bVar6 & 1U) != 0) {
      pcVar10 = L"Not optimized";
    }
    pcVar9 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&functionBody->super_ParseableFunctionInfo);
    Output::Trace(PerfHintPhase,
                  L"%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"
                  ,pcVar10,pWVar2,pcVar9,local_258,(ulong)local_38,(ulong)local_34,
                  stack0xffffffffffffffa8,pWVar3);
    Output::Flush();
  }
  return;
}

Assistant:

void WritePerfHint(PerfHints hint, Js::FunctionBody * functionBody, uint byteCodeOffset /*= Js::Constants::NoByteCodeOffset*/)
{
    Assert(functionBody);
    Assert(((uint)hint) < _countof(s_perfHintContainer));

    PerfHintItem item = s_perfHintContainer[(uint)hint];

    int level = CONFIG_FLAG(PerfHintLevel);
    Assert(level <= (int)PerfHintLevels::VERBOSE);

    if ((int)item.level <= level)
    {
        ULONG lineNumber = functionBody->GetLineNumber();
        LONG columnNumber = functionBody->GetColumnNumber();
        if (byteCodeOffset != Js::Constants::NoByteCodeOffset)
        {
            functionBody->GetLineCharOffset(byteCodeOffset, &lineNumber, &columnNumber, false /*canAllocateLineCache*/);

            // returned values are 0-based. Adjusting.
            lineNumber++;
            columnNumber++;
        }

        // We will print the short name.
        TCHAR shortName[255];
        Js::FunctionBody::GetShortNameFromUrl(functionBody->GetSourceName(), shortName, 255);

        OUTPUT_TRACE(Js::PerfHintPhase, _u("%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"),
            item.isNotOptimized ? _u("Not optimized") : _u("Optimized"),
            item.description,
            functionBody->GetExternalDisplayName(),
            shortName,
            lineNumber,
            columnNumber,
            item.consequences,
            item.suggestion);
        Output::Flush();
    }
}